

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  seqDef *psVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  U32 UVar15;
  ulong *puVar16;
  size_t sVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  ulong uVar21;
  BYTE *pBVar22;
  uint uVar23;
  uint uVar24;
  ulong *puVar25;
  U32 UVar26;
  BYTE *pBVar27;
  ulong uVar28;
  ulong *puVar29;
  uint uVar30;
  ulong *puVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  ulong *local_158;
  ulong local_148;
  U32 local_134;
  BYTE *local_128;
  ulong *local_d8;
  ulong *local_c0;
  int local_94;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar8 = (ms->window).base;
  pBVar9 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar8 + uVar5;
  local_134 = *rep;
  UVar26 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_158 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  local_d8 = (ulong *)src;
  if (local_158 < puVar4) {
    puVar16 = (ulong *)(pBVar9 + uVar5);
    iVar13 = uVar5 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    do {
      iVar35 = (int)local_158;
      local_94 = iVar35 - (int)pBVar8;
      uVar14 = (local_94 - local_134) + 1;
      pBVar18 = pBVar8;
      if (uVar14 < uVar5) {
        pBVar18 = pBVar9;
      }
      if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
         (*(int *)((long)local_158 + 1) == *(int *)(pBVar18 + uVar14))) {
        puVar29 = iEnd;
        if (uVar14 < uVar5) {
          puVar29 = puVar16;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)local_158 + 5),(BYTE *)((long)(pBVar18 + uVar14) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar29,iStart);
        pBVar18 = (BYTE *)(sVar17 + 4);
      }
      else {
        pBVar18 = (BYTE *)0x0;
      }
      if (cParams->searchLength - 6 < 2) {
        uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar10 = ms->chainTable;
        pBVar22 = (ms->window).base;
        pBVar27 = (ms->window).dictBase;
        uVar14 = (ms->window).dictLimit;
        uVar24 = (ms->window).lowLimit;
        uVar30 = iVar35 - (int)pBVar22;
        uVar23 = uVar30 - uVar34;
        if (uVar30 < uVar34) {
          uVar23 = 0;
        }
        uVar7 = cParams->searchLog;
        UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)local_158,6);
        if (UVar15 <= uVar24) goto LAB_0016c264;
        iVar35 = 1 << ((byte)uVar7 & 0x1f);
        uVar33 = 99999999;
        pBVar20 = (BYTE *)0x3;
        do {
          if (UVar15 < uVar14) {
            if (*(int *)(pBVar27 + UVar15) == (int)*local_158) {
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_158 + 4),pBVar27 + (ulong)UVar15 + 4,
                                  (BYTE *)iEnd,pBVar27 + uVar14,pBVar22 + uVar14);
              pBVar19 = (BYTE *)(sVar17 + 4);
            }
            else {
LAB_0016bd04:
              pBVar19 = (BYTE *)0x0;
            }
          }
          else {
            puVar29 = (ulong *)(pBVar22 + UVar15);
            if (pBVar20[(long)puVar29] != *(BYTE *)((long)local_158 + (long)pBVar20))
            goto LAB_0016bd04;
            puVar31 = local_158;
            if (local_158 < puVar1) {
              uVar21 = *local_158 ^ *puVar29;
              uVar28 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              pBVar19 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
              if (*puVar29 == *local_158) {
                do {
                  puVar31 = puVar31 + 1;
                  puVar29 = puVar29 + 1;
                  if (puVar1 <= puVar31) goto LAB_0016bd0c;
                  uVar21 = *puVar31 ^ *puVar29;
                  uVar28 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar19 = (BYTE *)((long)puVar31 + ((uVar28 >> 3 & 0x1fffffff) - (long)local_158))
                  ;
                } while (*puVar29 == *puVar31);
              }
            }
            else {
LAB_0016bd0c:
              if ((puVar31 < puVar2) && ((int)*puVar29 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar31 < puVar3) && ((short)*puVar29 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar31 < iEnd) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar31));
              }
              pBVar19 = (BYTE *)((long)puVar31 - (long)local_158);
            }
          }
          if ((pBVar20 < pBVar19) &&
             (uVar33 = (ulong)((uVar30 + 2) - UVar15), pBVar20 = pBVar19,
             (ulong *)((long)local_158 + (long)pBVar19) == iEnd)) {
            bVar12 = false;
          }
          else {
            pBVar19 = pBVar20;
            if (uVar23 < UVar15) {
              UVar15 = pUVar10[UVar15 & uVar34 - 1];
              bVar12 = true;
            }
            else {
              bVar12 = false;
            }
          }
        } while (((bVar12) && (uVar24 < UVar15)) &&
                (iVar35 = iVar35 + -1, pBVar20 = pBVar19, iVar35 != 0));
      }
      else if (cParams->searchLength == 5) {
        uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar10 = ms->chainTable;
        pBVar22 = (ms->window).base;
        pBVar27 = (ms->window).dictBase;
        uVar14 = (ms->window).dictLimit;
        uVar24 = (ms->window).lowLimit;
        uVar30 = iVar35 - (int)pBVar22;
        uVar23 = uVar30 - uVar34;
        if (uVar30 < uVar34) {
          uVar23 = 0;
        }
        uVar7 = cParams->searchLog;
        UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)local_158,5);
        if (uVar24 < UVar15) {
          iVar35 = 1 << ((byte)uVar7 & 0x1f);
          uVar33 = 99999999;
          pBVar20 = (BYTE *)0x3;
          do {
            if (UVar15 < uVar14) {
              if (*(int *)(pBVar27 + UVar15) == (int)*local_158) {
                sVar17 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_158 + 4),pBVar27 + (ulong)UVar15 + 4,
                                    (BYTE *)iEnd,pBVar27 + uVar14,pBVar22 + uVar14);
                pBVar19 = (BYTE *)(sVar17 + 4);
              }
              else {
LAB_0016bf65:
                pBVar19 = (BYTE *)0x0;
              }
            }
            else {
              puVar29 = (ulong *)(pBVar22 + UVar15);
              if (pBVar20[(long)puVar29] != *(BYTE *)((long)local_158 + (long)pBVar20))
              goto LAB_0016bf65;
              puVar31 = local_158;
              if (local_158 < puVar1) {
                uVar21 = *local_158 ^ *puVar29;
                uVar28 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                pBVar19 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                if (*puVar29 == *local_158) {
                  do {
                    puVar31 = puVar31 + 1;
                    puVar29 = puVar29 + 1;
                    if (puVar1 <= puVar31) goto LAB_0016bf6d;
                    uVar21 = *puVar31 ^ *puVar29;
                    uVar28 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar19 = (BYTE *)((long)puVar31 +
                                      ((uVar28 >> 3 & 0x1fffffff) - (long)local_158));
                  } while (*puVar29 == *puVar31);
                }
              }
              else {
LAB_0016bf6d:
                if ((puVar31 < puVar2) && ((int)*puVar29 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar31 < puVar3) && ((short)*puVar29 == (short)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar31 < iEnd) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar31));
                }
                pBVar19 = (BYTE *)((long)puVar31 - (long)local_158);
              }
            }
            if ((pBVar20 < pBVar19) &&
               (uVar33 = (ulong)((uVar30 + 2) - UVar15), pBVar20 = pBVar19,
               (ulong *)((long)local_158 + (long)pBVar19) == iEnd)) {
              bVar12 = false;
            }
            else {
              pBVar19 = pBVar20;
              if (uVar23 < UVar15) {
                UVar15 = pUVar10[UVar15 & uVar34 - 1];
                bVar12 = true;
              }
              else {
                bVar12 = false;
              }
            }
          } while (((bVar12) && (uVar24 < UVar15)) &&
                  (iVar35 = iVar35 + -1, pBVar20 = pBVar19, iVar35 != 0));
        }
        else {
LAB_0016c264:
          pBVar19 = (BYTE *)0x3;
          uVar33 = 99999999;
        }
      }
      else {
        uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar10 = ms->chainTable;
        pBVar22 = (ms->window).base;
        pBVar27 = (ms->window).dictBase;
        uVar14 = (ms->window).dictLimit;
        uVar24 = (ms->window).lowLimit;
        uVar30 = iVar35 - (int)pBVar22;
        uVar23 = uVar30 - uVar34;
        if (uVar30 < uVar34) {
          uVar23 = 0;
        }
        uVar7 = cParams->searchLog;
        UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)local_158,4);
        if (UVar15 <= uVar24) goto LAB_0016c264;
        iVar35 = 1 << ((byte)uVar7 & 0x1f);
        uVar33 = 99999999;
        pBVar20 = (BYTE *)0x3;
        do {
          if (UVar15 < uVar14) {
            if (*(int *)(pBVar27 + UVar15) == (int)*local_158) {
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_158 + 4),pBVar27 + (ulong)UVar15 + 4,
                                  (BYTE *)iEnd,pBVar27 + uVar14,pBVar22 + uVar14);
              pBVar19 = (BYTE *)(sVar17 + 4);
            }
            else {
LAB_0016c1bd:
              pBVar19 = (BYTE *)0x0;
            }
          }
          else {
            puVar29 = (ulong *)(pBVar22 + UVar15);
            if (pBVar20[(long)puVar29] != *(BYTE *)((long)local_158 + (long)pBVar20))
            goto LAB_0016c1bd;
            puVar31 = local_158;
            if (local_158 < puVar1) {
              uVar21 = *local_158 ^ *puVar29;
              uVar28 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              pBVar19 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
              if (*puVar29 == *local_158) {
                do {
                  puVar31 = puVar31 + 1;
                  puVar29 = puVar29 + 1;
                  if (puVar1 <= puVar31) goto LAB_0016c1c5;
                  uVar21 = *puVar31 ^ *puVar29;
                  uVar28 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar19 = (BYTE *)((long)puVar31 + ((uVar28 >> 3 & 0x1fffffff) - (long)local_158))
                  ;
                } while (*puVar29 == *puVar31);
              }
            }
            else {
LAB_0016c1c5:
              if ((puVar31 < puVar2) && ((int)*puVar29 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar31 < puVar3) && ((short)*puVar29 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar31 < iEnd) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar31));
              }
              pBVar19 = (BYTE *)((long)puVar31 - (long)local_158);
            }
          }
          if ((pBVar20 < pBVar19) &&
             (uVar33 = (ulong)((uVar30 + 2) - UVar15), pBVar20 = pBVar19,
             (ulong *)((long)local_158 + (long)pBVar19) == iEnd)) {
            bVar12 = false;
          }
          else {
            pBVar19 = pBVar20;
            if (uVar23 < UVar15) {
              UVar15 = pUVar10[UVar15 & uVar34 - 1];
              bVar12 = true;
            }
            else {
              bVar12 = false;
            }
          }
        } while (((bVar12) && (uVar24 < UVar15)) &&
                (iVar35 = iVar35 + -1, pBVar20 = pBVar19, iVar35 != 0));
      }
      local_128 = pBVar18;
      if (pBVar18 < pBVar19) {
        local_128 = pBVar19;
      }
      if (local_128 < (BYTE *)0x4) {
        local_158 = (ulong *)((long)local_158 + ((long)local_158 - (long)local_d8 >> 8) + 1);
      }
      else {
        local_c0 = local_158;
        if (pBVar19 <= pBVar18) {
          uVar33 = 0;
          local_c0 = (ulong *)((long)local_158 + 1);
        }
        do {
          if (puVar4 <= local_158) break;
          puVar29 = (ulong *)((long)local_158 + 1);
          local_94 = local_94 + 1;
          if (uVar33 == 0) {
            uVar33 = 0;
          }
          else {
            uVar14 = local_94 - local_134;
            pBVar18 = pBVar8;
            if (uVar14 < uVar5) {
              pBVar18 = pBVar9;
            }
            if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
               (*(int *)puVar29 == *(int *)(pBVar18 + uVar14))) {
              puVar31 = iEnd;
              if (uVar14 < uVar5) {
                puVar31 = puVar16;
              }
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_158 + 5),
                                  (BYTE *)((long)(pBVar18 + uVar14) + 4),(BYTE *)iEnd,
                                  (BYTE *)puVar31,iStart);
              if (sVar17 < 0xfffffffffffffffc) {
                uVar24 = (int)uVar33 + 1;
                uVar14 = 0x1f;
                if (uVar24 != 0) {
                  for (; uVar24 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                  }
                }
                if ((int)((uVar14 ^ 0x1f) + (int)local_128 * 3 + -0x1e) <
                    (int)(BYTE *)(sVar17 + 4) * 3) {
                  uVar33 = 0;
                  local_128 = (BYTE *)(sVar17 + 4);
                  local_c0 = puVar29;
                }
              }
            }
          }
          iVar35 = (int)puVar29;
          if (cParams->searchLength - 6 < 2) {
            uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
            pUVar10 = ms->chainTable;
            pBVar18 = (ms->window).base;
            pBVar22 = (ms->window).dictBase;
            uVar14 = (ms->window).dictLimit;
            uVar24 = (ms->window).lowLimit;
            uVar30 = iVar35 - (int)pBVar18;
            uVar23 = uVar30 - uVar34;
            if (uVar30 < uVar34) {
              uVar23 = 0;
            }
            uVar7 = cParams->searchLog;
            UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar29,6);
            if (UVar15 <= uVar24) goto LAB_0016cb63;
            iVar35 = 1 << ((byte)uVar7 & 0x1f);
            local_148 = 99999999;
            pBVar27 = (BYTE *)0x3;
            do {
              if (UVar15 < uVar14) {
                if (*(int *)(pBVar22 + UVar15) == *(int *)puVar29) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)local_158 + 5),pBVar22 + (ulong)UVar15 + 4,
                                      (BYTE *)iEnd,pBVar22 + uVar14,pBVar18 + uVar14);
                  pBVar20 = (BYTE *)(sVar17 + 4);
                }
                else {
LAB_0016c5cc:
                  pBVar20 = (BYTE *)0x0;
                }
              }
              else {
                puVar31 = (ulong *)(pBVar18 + UVar15);
                if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar29 + (long)pBVar27))
                goto LAB_0016c5cc;
                puVar25 = puVar29;
                if (puVar29 < puVar1) {
                  uVar21 = *puVar29 ^ *puVar31;
                  uVar28 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar20 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                  puVar25 = (ulong *)((long)local_158 + 9);
                  if (*puVar31 == *puVar29) {
                    do {
                      puVar31 = puVar31 + 1;
                      if (puVar1 <= puVar25) goto LAB_0016c5d4;
                      uVar28 = *puVar25;
                      uVar32 = uVar28 ^ *puVar31;
                      uVar21 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar32 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      pBVar20 = (BYTE *)((long)puVar25 +
                                        ((uVar21 >> 3 & 0x1fffffff) - (long)puVar29));
                      puVar25 = puVar25 + 1;
                    } while (*puVar31 == uVar28);
                  }
                }
                else {
LAB_0016c5d4:
                  if ((puVar25 < puVar2) && ((int)*puVar31 == (int)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar25 < puVar3) && ((short)*puVar31 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar25 < iEnd) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar25));
                  }
                  pBVar20 = (BYTE *)((long)puVar25 - (long)puVar29);
                }
              }
              if ((pBVar27 < pBVar20) &&
                 (local_148 = (ulong)((uVar30 + 2) - UVar15), pBVar27 = pBVar20,
                 (ulong *)((long)puVar29 + (long)pBVar20) == iEnd)) {
                bVar12 = false;
              }
              else {
                pBVar20 = pBVar27;
                if (uVar23 < UVar15) {
                  UVar15 = pUVar10[UVar15 & uVar34 - 1];
                  bVar12 = true;
                }
                else {
                  bVar12 = false;
                }
              }
            } while (((bVar12) && (uVar24 < UVar15)) &&
                    (iVar35 = iVar35 + -1, pBVar27 = pBVar20, iVar35 != 0));
          }
          else if (cParams->searchLength == 5) {
            uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
            pUVar10 = ms->chainTable;
            pBVar18 = (ms->window).base;
            pBVar22 = (ms->window).dictBase;
            uVar14 = (ms->window).dictLimit;
            uVar24 = (ms->window).lowLimit;
            uVar30 = iVar35 - (int)pBVar18;
            uVar23 = uVar30 - uVar34;
            if (uVar30 < uVar34) {
              uVar23 = 0;
            }
            uVar7 = cParams->searchLog;
            UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar29,5);
            if (uVar24 < UVar15) {
              iVar35 = 1 << ((byte)uVar7 & 0x1f);
              local_148 = 99999999;
              pBVar27 = (BYTE *)0x3;
              do {
                if (UVar15 < uVar14) {
                  if (*(int *)(pBVar22 + UVar15) == *(int *)puVar29) {
                    sVar17 = ZSTD_count_2segments
                                       ((BYTE *)((long)local_158 + 5),pBVar22 + (ulong)UVar15 + 4,
                                        (BYTE *)iEnd,pBVar22 + uVar14,pBVar18 + uVar14);
                    pBVar20 = (BYTE *)(sVar17 + 4);
                  }
                  else {
LAB_0016c851:
                    pBVar20 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar31 = (ulong *)(pBVar18 + UVar15);
                  if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar29 + (long)pBVar27))
                  goto LAB_0016c851;
                  puVar25 = puVar29;
                  if (puVar29 < puVar1) {
                    uVar21 = *puVar29 ^ *puVar31;
                    uVar28 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar20 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                    puVar25 = (ulong *)((long)local_158 + 9);
                    if (*puVar31 == *puVar29) {
                      do {
                        puVar31 = puVar31 + 1;
                        if (puVar1 <= puVar25) goto LAB_0016c859;
                        uVar28 = *puVar25;
                        uVar32 = uVar28 ^ *puVar31;
                        uVar21 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                          }
                        }
                        pBVar20 = (BYTE *)((long)puVar25 +
                                          ((uVar21 >> 3 & 0x1fffffff) - (long)puVar29));
                        puVar25 = puVar25 + 1;
                      } while (*puVar31 == uVar28);
                    }
                  }
                  else {
LAB_0016c859:
                    if ((puVar25 < puVar2) && ((int)*puVar31 == (int)*puVar25)) {
                      puVar25 = (ulong *)((long)puVar25 + 4);
                      puVar31 = (ulong *)((long)puVar31 + 4);
                    }
                    if ((puVar25 < puVar3) && ((short)*puVar31 == (short)*puVar25)) {
                      puVar25 = (ulong *)((long)puVar25 + 2);
                      puVar31 = (ulong *)((long)puVar31 + 2);
                    }
                    if (puVar25 < iEnd) {
                      puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar25))
                      ;
                    }
                    pBVar20 = (BYTE *)((long)puVar25 - (long)puVar29);
                  }
                }
                if ((pBVar27 < pBVar20) &&
                   (local_148 = (ulong)((uVar30 + 2) - UVar15), pBVar27 = pBVar20,
                   (ulong *)((long)puVar29 + (long)pBVar20) == iEnd)) {
                  bVar12 = false;
                }
                else {
                  pBVar20 = pBVar27;
                  if (uVar23 < UVar15) {
                    UVar15 = pUVar10[UVar15 & uVar34 - 1];
                    bVar12 = true;
                  }
                  else {
                    bVar12 = false;
                  }
                }
              } while (((bVar12) && (uVar24 < UVar15)) &&
                      (iVar35 = iVar35 + -1, pBVar27 = pBVar20, iVar35 != 0));
            }
            else {
LAB_0016cb63:
              pBVar20 = (BYTE *)0x3;
              local_148 = 99999999;
            }
          }
          else {
            uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
            pUVar10 = ms->chainTable;
            pBVar18 = (ms->window).base;
            pBVar22 = (ms->window).dictBase;
            uVar14 = (ms->window).dictLimit;
            uVar24 = (ms->window).lowLimit;
            uVar30 = iVar35 - (int)pBVar18;
            uVar23 = uVar30 - uVar34;
            if (uVar30 < uVar34) {
              uVar23 = 0;
            }
            uVar7 = cParams->searchLog;
            UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar29,4);
            if (UVar15 <= uVar24) goto LAB_0016cb63;
            iVar35 = 1 << ((byte)uVar7 & 0x1f);
            local_148 = 99999999;
            pBVar27 = (BYTE *)0x3;
            do {
              if (UVar15 < uVar14) {
                if (*(int *)(pBVar22 + UVar15) == *(int *)puVar29) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)local_158 + 5),pBVar22 + (ulong)UVar15 + 4,
                                      (BYTE *)iEnd,pBVar22 + uVar14,pBVar18 + uVar14);
                  pBVar20 = (BYTE *)(sVar17 + 4);
                }
                else {
LAB_0016caba:
                  pBVar20 = (BYTE *)0x0;
                }
              }
              else {
                puVar31 = (ulong *)(pBVar18 + UVar15);
                if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar29 + (long)pBVar27))
                goto LAB_0016caba;
                puVar25 = puVar29;
                if (puVar29 < puVar1) {
                  uVar21 = *puVar29 ^ *puVar31;
                  uVar28 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar20 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                  puVar25 = (ulong *)((long)local_158 + 9);
                  if (*puVar31 == *puVar29) {
                    do {
                      puVar31 = puVar31 + 1;
                      if (puVar1 <= puVar25) goto LAB_0016cac2;
                      uVar28 = *puVar25;
                      uVar32 = uVar28 ^ *puVar31;
                      uVar21 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar32 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      pBVar20 = (BYTE *)((long)puVar25 +
                                        ((uVar21 >> 3 & 0x1fffffff) - (long)puVar29));
                      puVar25 = puVar25 + 1;
                    } while (*puVar31 == uVar28);
                  }
                }
                else {
LAB_0016cac2:
                  if ((puVar25 < puVar2) && ((int)*puVar31 == (int)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar25 < puVar3) && ((short)*puVar31 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar25 < iEnd) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar25));
                  }
                  pBVar20 = (BYTE *)((long)puVar25 - (long)puVar29);
                }
              }
              if ((pBVar27 < pBVar20) &&
                 (local_148 = (ulong)((uVar30 + 2) - UVar15), pBVar27 = pBVar20,
                 (ulong *)((long)puVar29 + (long)pBVar20) == iEnd)) {
                bVar12 = false;
              }
              else {
                pBVar20 = pBVar27;
                if (uVar23 < UVar15) {
                  UVar15 = pUVar10[UVar15 & uVar34 - 1];
                  bVar12 = true;
                }
                else {
                  bVar12 = false;
                }
              }
            } while (((bVar12) && (uVar24 < UVar15)) &&
                    (iVar35 = iVar35 + -1, pBVar27 = pBVar20, iVar35 != 0));
          }
          bVar12 = true;
          if ((BYTE *)0x3 < pBVar20) {
            uVar24 = (int)uVar33 + 1;
            uVar14 = 0x1f;
            if (uVar24 != 0) {
              for (; uVar24 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar24 = (int)local_148 + 1;
            iVar35 = 0x1f;
            if (uVar24 != 0) {
              for (; uVar24 >> iVar35 == 0; iVar35 = iVar35 + -1) {
              }
            }
            if ((int)((uVar14 ^ 0x1f) + (int)local_128 * 4 + -0x1b) < (int)pBVar20 * 4 - iVar35) {
              bVar12 = false;
              uVar33 = local_148;
              local_128 = pBVar20;
              local_c0 = puVar29;
            }
          }
          local_158 = puVar29;
        } while (!bVar12);
        if (uVar33 == 0) {
          UVar15 = 1;
        }
        else {
          pBVar27 = (BYTE *)((long)local_c0 + (2 - (long)(pBVar8 + uVar33)));
          pBVar22 = iStart;
          pBVar18 = pBVar8;
          if ((uint)pBVar27 < uVar5) {
            pBVar22 = pBVar9 + uVar6;
            pBVar18 = pBVar9;
          }
          if ((local_d8 < local_c0) &&
             (uVar28 = (ulong)pBVar27 & 0xffffffff, pBVar22 < pBVar18 + uVar28)) {
            pBVar18 = pBVar18 + uVar28;
            do {
              puVar29 = (ulong *)((long)local_c0 + -1);
              pBVar18 = pBVar18 + -1;
              if ((*(BYTE *)puVar29 != *pBVar18) ||
                 (local_128 = local_128 + 1, local_c0 = puVar29, puVar29 <= local_d8)) break;
            } while (pBVar22 < pBVar18);
          }
          UVar15 = (int)uVar33 + 1;
          UVar26 = local_134;
          local_134 = (int)uVar33 - 2;
        }
        uVar33 = (long)local_c0 - (long)local_d8;
        puVar31 = (ulong *)seqStore->lit;
        puVar29 = (ulong *)((long)puVar31 + uVar33);
        do {
          *puVar31 = *local_d8;
          puVar31 = puVar31 + 1;
          local_d8 = local_d8 + 1;
        } while (puVar31 < puVar29);
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar11 = seqStore->sequences;
        psVar11->litLength = (U16)uVar33;
        psVar11->offset = UVar15;
        if ((BYTE *)0xffff < local_128 + -3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar11->matchLength = (U16)(local_128 + -3);
        seqStore->sequences = psVar11 + 1;
        local_158 = (ulong *)((long)local_c0 + (long)local_128);
        local_d8 = local_158;
        do {
          if (puVar4 < local_158) break;
          uVar14 = (uint)((long)local_158 - (long)(pBVar8 + UVar26));
          pBVar18 = pBVar8;
          if (uVar14 < uVar5) {
            pBVar18 = pBVar9;
          }
          if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
             ((int)*local_158 ==
              *(int *)(pBVar18 + ((long)local_158 - (long)(pBVar8 + UVar26) & 0xffffffff)))) {
            puVar29 = iEnd;
            if (uVar14 < uVar5) {
              puVar29 = puVar16;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)local_158 + 4),
                                (BYTE *)((long)(pBVar18 +
                                               ((long)local_158 - (long)(pBVar8 + UVar26) &
                                               0xffffffff)) + 4),(BYTE *)iEnd,(BYTE *)puVar29,iStart
                               );
            *(ulong *)seqStore->lit = *local_d8;
            psVar11 = seqStore->sequences;
            psVar11->litLength = 0;
            psVar11->offset = 1;
            if (0xffff < sVar17 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar11->matchLength = (U16)(sVar17 + 1);
            seqStore->sequences = psVar11 + 1;
            local_158 = (ulong *)((long)local_158 + sVar17 + 4);
            bVar12 = true;
            UVar15 = local_134;
            local_134 = UVar26;
            local_d8 = local_158;
          }
          else {
            bVar12 = false;
            UVar15 = UVar26;
          }
          UVar26 = UVar15;
        } while (bVar12);
      }
    } while (local_158 < puVar4);
  }
  *rep = local_134;
  rep[1] = UVar26;
  return (long)iEnd - (long)local_d8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 1);
}